

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expFuncToHex(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
            vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  bool bVar1;
  long *args_1;
  string local_70;
  StringLiteral local_50;
  int64_t local_30;
  int64_t digits;
  int64_t value;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters_local;
  Identifier *funcName_local;
  
  value = (int64_t)parameters;
  parameters_local = (vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)funcName;
  funcName_local = (Identifier *)__return_storage_ptr__;
  bVar1 = getExpFuncParameter(parameters,0,&digits,funcName,false);
  if (bVar1) {
    local_30 = 8;
    args_1 = (long *)0x1;
    bVar1 = getExpFuncParameter((vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)value,1
                                ,&local_30,(Identifier *)parameters_local,true);
    if (bVar1) {
      tinyformat::format<long,long>(&local_70,(tinyformat *)"%0*X",(char *)&local_30,&digits,args_1)
      ;
      StringLiteral::StringLiteral(&local_50,&local_70);
      ExpressionValue::ExpressionValue(__return_storage_ptr__,&local_50);
      StringLiteral::~StringLiteral(&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      ExpressionValue::ExpressionValue(__return_storage_ptr__);
    }
  }
  else {
    ExpressionValue::ExpressionValue(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncToHex(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	int64_t value, digits;
	GET_PARAM(parameters,0,value);
	GET_OPTIONAL_PARAM(parameters,1,digits,8);

	return ExpressionValue(tfm::format("%0*X",digits,value));
}